

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlCopyPropInternal(xmlDocPtr doc,xmlNodePtr target,xmlAttrPtr cur)

{
  xmlDocPtr doc_00;
  _xmlDoc *p_Var1;
  _xmlDoc *p_Var2;
  int iVar3;
  xmlNodePtr parent;
  xmlNsPtr pxVar4;
  _xmlNode *p_Var5;
  xmlChar *pxVar6;
  _xmlDoc *p_Var7;
  _xmlNode *p_Var8;
  _xmlNode *p_Var9;
  _xmlDoc *node;
  
  if (cur == (xmlAttrPtr)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (target == (xmlNodePtr)0x0) {
    if (doc != (xmlDocPtr)0x0) goto LAB_001850e0;
    p_Var5 = cur->parent;
    if ((p_Var5 != (_xmlNode *)0x0) || (p_Var5 = cur->children, p_Var5 != (_xmlNode *)0x0)) {
      doc = p_Var5->doc;
      goto LAB_001850e0;
    }
    pxVar6 = cur->name;
    doc = (xmlDocPtr)0x0;
  }
  else {
    if (target->type != XML_ELEMENT_NODE) {
      return (xmlAttrPtr)0x0;
    }
    doc = target->doc;
LAB_001850e0:
    pxVar6 = cur->name;
  }
  parent = (xmlNodePtr)xmlNewDocProp(doc,pxVar6,(xmlChar *)0x0);
  if (parent == (xmlNodePtr)0x0) {
    return (xmlAttrPtr)0x0;
  }
  parent->parent = target;
  if (cur->ns == (xmlNs *)0x0 || target == (xmlNodePtr)0x0) {
    pxVar4 = (xmlNs *)0x0;
  }
  else {
    pxVar4 = xmlSearchNs(target->doc,target,cur->ns->prefix);
    if (pxVar4 == (xmlNsPtr)0x0) {
      pxVar4 = xmlSearchNs(cur->doc,cur->parent,cur->ns->prefix);
      if (pxVar4 == (xmlNsPtr)0x0) goto LAB_001851ab;
      p_Var1 = (_xmlDoc *)0x0;
      p_Var2 = (_xmlDoc *)target;
      do {
        p_Var7 = p_Var2;
        node = p_Var1;
        p_Var1 = p_Var7;
        p_Var2 = (_xmlDoc *)p_Var7->parent;
      } while ((_xmlDoc *)p_Var7->parent != (_xmlDoc *)0x0);
      if (p_Var7 != target->doc) {
        node = p_Var7;
      }
      pxVar4 = xmlNewNs((xmlNodePtr)node,pxVar4->href,pxVar4->prefix);
    }
    else {
      iVar3 = xmlStrEqual(pxVar4->href,cur->ns->href);
      if (iVar3 == 0) {
        pxVar4 = xmlNewReconciledNs(target->doc,target,cur->ns);
      }
    }
  }
  parent->ns = pxVar4;
LAB_001851ab:
  if (cur->children != (xmlNodePtr)0x0) {
    p_Var5 = xmlStaticCopyNodeList(cur->children,parent->doc,parent);
    parent->children = p_Var5;
    p_Var9 = (_xmlNode *)0x0;
    while (p_Var8 = p_Var5, p_Var8 != (_xmlNode *)0x0) {
      p_Var5 = p_Var8->next;
      if (p_Var5 == (_xmlNode *)0x0) {
        p_Var9 = p_Var8;
      }
    }
    parent->last = p_Var9;
  }
  if (target == (xmlNodePtr)0x0) {
    return (xmlAttrPtr)parent;
  }
  if (target->doc == (_xmlDoc *)0x0) {
    return (xmlAttrPtr)parent;
  }
  doc_00 = cur->doc;
  if (doc_00 == (xmlDocPtr)0x0) {
    return (xmlAttrPtr)parent;
  }
  if (doc_00->ids == (void *)0x0) {
    return (xmlAttrPtr)parent;
  }
  if (cur->parent == (xmlNodePtr)0x0) {
    return (xmlAttrPtr)parent;
  }
  iVar3 = xmlIsID(doc_00,cur->parent,cur);
  if (iVar3 == 0) {
    return (xmlAttrPtr)parent;
  }
  pxVar6 = xmlNodeListGetString(cur->doc,cur->children,1);
  if (pxVar6 != (xmlChar *)0x0) {
    xmlAddID((xmlValidCtxtPtr)0x0,target->doc,pxVar6,(xmlAttrPtr)parent);
    (*xmlFree)(pxVar6);
    return (xmlAttrPtr)parent;
  }
  return (xmlAttrPtr)parent;
}

Assistant:

static xmlAttrPtr
xmlCopyPropInternal(xmlDocPtr doc, xmlNodePtr target, xmlAttrPtr cur) {
    xmlAttrPtr ret;

    if (cur == NULL) return(NULL);
    if ((target != NULL) && (target->type != XML_ELEMENT_NODE))
        return(NULL);
    if (target != NULL)
	ret = xmlNewDocProp(target->doc, cur->name, NULL);
    else if (doc != NULL)
	ret = xmlNewDocProp(doc, cur->name, NULL);
    else if (cur->parent != NULL)
	ret = xmlNewDocProp(cur->parent->doc, cur->name, NULL);
    else if (cur->children != NULL)
	ret = xmlNewDocProp(cur->children->doc, cur->name, NULL);
    else
	ret = xmlNewDocProp(NULL, cur->name, NULL);
    if (ret == NULL) return(NULL);
    ret->parent = target;

    if ((cur->ns != NULL) && (target != NULL)) {
      xmlNsPtr ns;

      ns = xmlSearchNs(target->doc, target, cur->ns->prefix);
      if (ns == NULL) {
        /*
         * Humm, we are copying an element whose namespace is defined
         * out of the new tree scope. Search it in the original tree
         * and add it at the top of the new tree
         */
        ns = xmlSearchNs(cur->doc, cur->parent, cur->ns->prefix);
        if (ns != NULL) {
          xmlNodePtr root = target;
          xmlNodePtr pred = NULL;

          while (root->parent != NULL) {
            pred = root;
            root = root->parent;
          }
          if (root == (xmlNodePtr) target->doc) {
            /* correct possibly cycling above the document elt */
            root = pred;
          }
          ret->ns = xmlNewNs(root, ns->href, ns->prefix);
        }
      } else {
        /*
         * we have to find something appropriate here since
         * we can't be sure, that the namespace we found is identified
         * by the prefix
         */
        if (xmlStrEqual(ns->href, cur->ns->href)) {
          /* this is the nice case */
          ret->ns = ns;
        } else {
          /*
           * we are in trouble: we need a new reconciled namespace.
           * This is expensive
           */
          ret->ns = xmlNewReconciledNs(target->doc, target, cur->ns);
        }
      }

    } else
        ret->ns = NULL;

    if (cur->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(cur->children, ret->doc, (xmlNodePtr) ret);
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    /* tmp->parent = (xmlNodePtr)ret; */
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    /*
     * Try to handle IDs
     */
    if ((target!= NULL) && (cur!= NULL) &&
	(target->doc != NULL) && (cur->doc != NULL) &&
	(cur->doc->ids != NULL) && (cur->parent != NULL)) {
	if (xmlIsID(cur->doc, cur->parent, cur)) {
	    xmlChar *id;

	    id = xmlNodeListGetString(cur->doc, cur->children, 1);
	    if (id != NULL) {
		xmlAddID(NULL, target->doc, id, ret);
		xmlFree(id);
	    }
	}
    }
    return(ret);
}